

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_ASAi_dns.c
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 *userdata;
  N_Vector yy;
  N_Vector yd;
  N_Vector p_Var3;
  long *plVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  undefined8 uVar8;
  char *pcVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  int indexB;
  SUNContext ctx;
  sunrealtype time;
  long nst;
  int ncheck;
  long nstB;
  uint local_9c;
  undefined8 local_98;
  undefined1 local_90 [8];
  long *local_88;
  long local_80;
  long local_78;
  long *local_70;
  long *local_68;
  long local_60;
  long local_58;
  undefined8 local_50;
  long local_48;
  undefined1 local_3c [4];
  undefined8 local_38;
  
  puts("\nAdjoint Sensitivity Example for Akzo-Nobel Chemical Kinetics");
  puts("-------------------------------------------------------------");
  puts("Sensitivity of G = int_t0^tf (y1) dt with respect to IC.");
  puts("-------------------------------------------------------------\n");
  uVar2 = SUNContext_Create(0,&local_98);
  if ((int)uVar2 < 0) {
    pcVar9 = "SUNContext_Create";
  }
  else {
    userdata = (undefined8 *)malloc(0x48);
    *userdata = 0x4032b33333333333;
    userdata[1] = 0x3fe28f5c28f5c28f;
    userdata[2] = 0x3fb70a3d70a3d70a;
    userdata[3] = 0x3fdae147ae147ae1;
    userdata[4] = 0x4041333333333333;
    userdata[5] = 0x400a666666666666;
    *(undefined4 *)(userdata + 6) = 0xb851eb85;
    *(undefined4 *)((long)userdata + 0x34) = 0x405cf51e;
    *(undefined4 *)(userdata + 7) = 0xcccccccd;
    *(undefined4 *)((long)userdata + 0x3c) = 0x3feccccc;
    userdata[8] = 0x4087080000000000;
    yy = (N_Vector)N_VNew_Serial(6,local_98);
    if (yy == (N_Vector)0x0) {
      main_cold_10();
      return 1;
    }
    yd = (N_Vector)N_VClone(yy);
    if (yd == (N_Vector)0x0) {
      main_cold_9();
      return 1;
    }
    puVar1 = *(undefined8 **)((long)yy->content + 0x10);
    *puVar1 = 0x3fdc6a7ef9db22d1;
    puVar1[1] = 0x3f5426fe718a86d7;
    puVar1[2] = 0;
    puVar1[3] = 0x3f7cac083126e979;
    puVar1[4] = 0;
    puVar1[5] = (double)userdata[6] * 0.444 * 0.007;
    N_VConst(0,yd);
    p_Var3 = (N_Vector)N_VClone(yy);
    res((sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),yy,yd,p_Var3,userdata);
    N_VScale(0,p_Var3,yd);
    N_VDestroy(p_Var3);
    plVar4 = (long *)N_VNew_Serial(1,local_98);
    if (plVar4 == (long *)0x0) {
      main_cold_8();
      return 1;
    }
    **(undefined8 **)(*plVar4 + 0x10) = 0;
    lVar5 = IDACreate(local_98);
    local_48 = lVar5;
    if (lVar5 == 0) {
      main_cold_7();
      return 1;
    }
    uVar2 = IDAInit(0,lVar5,res,yy,yd);
    if ((int)uVar2 < 0) {
      pcVar9 = "IDAInit";
    }
    else {
      uVar2 = IDASStolerances(0xe2308c3a,0x3ddb7cdfd9d7bdbb,lVar5);
      if ((int)uVar2 < 0) {
        pcVar9 = "IDASStolerances";
      }
      else {
        uVar2 = IDASetUserData(lVar5,userdata);
        if ((int)uVar2 < 0) {
          pcVar9 = "IDASetUserData";
        }
        else {
          lVar6 = SUNDenseMatrix(6,6,local_98);
          if (lVar6 == 0) {
            main_cold_6();
            return 1;
          }
          local_58 = SUNLinSol_Dense(yy,lVar6,local_98);
          if (local_58 == 0) {
            main_cold_5();
            return 1;
          }
          uVar2 = IDASetLinearSolver(lVar5,local_58,lVar6);
          if ((int)uVar2 < 0) {
            pcVar9 = "IDASetLinearSolver";
          }
          else {
            uVar2 = IDAQuadInit(lVar5,rhsQ,plVar4);
            if ((int)uVar2 < 0) {
              pcVar9 = "IDAQuadInit";
            }
            else {
              uVar2 = IDAQuadSStolerances(0xd9d7bdbb,0x3d719799812dea11,lVar5);
              if (-1 < (int)uVar2) {
                local_60 = lVar6;
                uVar2 = IDASetQuadErrCon(lVar5,1);
                if ((int)uVar2 < 0) {
                  pcVar9 = "IDASetQuadErrCon";
                }
                else {
                  uVar2 = IDAAdjInit(lVar5,0x96,1);
                  if ((int)uVar2 < 0) {
                    pcVar9 = "IDAAdjInit";
                  }
                  else {
                    printf("Forward integration ... ");
                    uVar2 = IDASolveF(0,lVar5,local_90,yy,yd,1,local_3c);
                    if (-1 < (int)uVar2) {
                      uVar2 = IDAGetNumSteps(lVar5,&local_50);
                      if ((int)uVar2 < 0) {
                        pcVar9 = "IDAGetNumSteps";
                      }
                      else {
                        printf("done ( nst = %ld )\n",local_50);
                        uVar2 = IDAGetQuad(lVar5,local_90,plVar4);
                        if ((int)uVar2 < 0) {
                          pcVar9 = "IDAGetQuad";
                        }
                        else {
                          local_68 = plVar4;
                          printf("G:          %24.16f \n",(int)**(undefined8 **)(*plVar4 + 0x10));
                          puts("--------------------------------------------------------\n");
                          plVar4 = (long *)N_VClone(yy);
                          if (plVar4 == (long *)0x0) {
                            main_cold_4();
                            return 1;
                          }
                          N_VConst(0,plVar4);
                          plVar7 = (long *)N_VClone(plVar4);
                          if (plVar7 == (long *)0x0) {
                            main_cold_3();
                            return 1;
                          }
                          N_VConst(0,plVar7);
                          **(undefined8 **)(*plVar7 + 0x10) = 0xbff0000000000000;
                          uVar2 = IDACreateB(lVar5,&local_9c);
                          if ((int)uVar2 < 0) {
                            pcVar9 = "IDACreateB";
                          }
                          else {
                            uVar2 = IDAInitB(0,lVar5,local_9c,resB,plVar4,plVar7);
                            if ((int)uVar2 < 0) {
                              pcVar9 = "IDAInitB";
                            }
                            else {
                              uVar2 = IDASStolerancesB(0xa0b5ed8d,0x3e45798ee2308c3a,lVar5,local_9c)
                              ;
                              if ((int)uVar2 < 0) {
                                pcVar9 = "IDASStolerancesB";
                              }
                              else {
                                uVar2 = IDASetUserDataB(lVar5,local_9c,userdata);
                                if ((int)uVar2 < 0) {
                                  pcVar9 = "IDASetUserDataB";
                                }
                                else {
                                  IDASetMaxNumStepsB(lVar5,local_9c,1000);
                                  lVar6 = SUNDenseMatrix(6,6,local_98);
                                  if (lVar6 == 0) {
                                    main_cold_2();
                                    return 1;
                                  }
                                  local_70 = plVar4;
                                  local_80 = SUNLinSol_Dense(plVar4,lVar6,local_98);
                                  if (local_80 == 0) {
                                    main_cold_1();
                                    return 1;
                                  }
                                  local_78 = lVar6;
                                  uVar2 = IDASetLinearSolverB(lVar5,local_9c,local_80,lVar6);
                                  if ((int)uVar2 < 0) {
                                    pcVar9 = "IDASetLinearSolverB";
                                  }
                                  else {
                                    local_88 = plVar7;
                                    printf("Backward integration ... ");
                                    uVar2 = IDASolveB(0,lVar5,1);
                                    if ((int)uVar2 < 0) {
                                      pcVar9 = "IDASolveB";
                                      goto LAB_00102d2b;
                                    }
                                    uVar8 = IDAGetAdjIDABmem(lVar5,local_9c);
                                    IDAGetNumSteps(uVar8,&local_38);
                                    printf("done ( nst = %ld )\n",local_38);
                                    plVar7 = local_70;
                                    plVar4 = local_88;
                                    p_Var3 = (N_Vector)(ulong)local_9c;
                                    uVar2 = IDAGetB(lVar5,p_Var3,local_90,local_70,local_88);
                                    if (-1 < (int)uVar2) {
                                      PrintOutput((sunrealtype)
                                                  CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00),
                                                  *(N_Vector *)(*plVar7 + 0x10),p_Var3);
                                      IDAFree(&local_48);
                                      SUNLinSolFree(local_58);
                                      SUNMatDestroy(local_60);
                                      SUNLinSolFree(local_80);
                                      SUNMatDestroy(local_78);
                                      N_VDestroy(yy);
                                      N_VDestroy(yd);
                                      N_VDestroy(plVar7);
                                      N_VDestroy(plVar4);
                                      N_VDestroy(local_68);
                                      free(userdata);
                                      SUNContext_Free(&local_98);
                                      return 0;
                                    }
                                    pcVar9 = "IDAGetB";
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      goto LAB_00102d4e;
                    }
                    pcVar9 = "IDASolveF";
                  }
                }
LAB_00102d2b:
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar9,
                        (ulong)uVar2);
                return 1;
              }
              pcVar9 = "IDAQuadSStolerances";
            }
          }
        }
      }
    }
  }
LAB_00102d4e:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar9,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  UserData data;
  void* mem;
  N_Vector yy, yp, rr, q;
  N_Vector yB, ypB;
  int ncheck, retval;
  sunrealtype time;
  long int nst, nstB;
  int indexB;
  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;
  SUNContext ctx;

  /* Consistent IC for  y, y'. */
  const sunrealtype y01 = SUN_RCONST(0.444);
  const sunrealtype y02 = SUN_RCONST(0.00123);
  const sunrealtype y03 = SUN_RCONST(0.0);
  const sunrealtype y04 = SUN_RCONST(0.007);
  const sunrealtype y05 = SUN_RCONST(0.0);

  mem = NULL;
  yy = yp = NULL;
  A = AB = NULL;
  LS = LSB = NULL;

  printf("\nAdjoint Sensitivity Example for Akzo-Nobel Chemical Kinetics\n");
  printf("-------------------------------------------------------------\n");
  printf("Sensitivity of G = int_t0^tf (y1) dt with respect to IC.\n");
  printf("-------------------------------------------------------------\n\n");

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate user data. */
  data = (UserData)malloc(sizeof(*data));

  /* Fill user's data with the appropriate values for coefficients. */
  data->k1   = SUN_RCONST(18.7);
  data->k2   = SUN_RCONST(0.58);
  data->k3   = SUN_RCONST(0.09);
  data->k4   = SUN_RCONST(0.42);
  data->K    = SUN_RCONST(34.4);
  data->klA  = SUN_RCONST(3.3);
  data->Ks   = SUN_RCONST(115.83);
  data->pCO2 = SUN_RCONST(0.9);
  data->H    = SUN_RCONST(737.0);

  /* Allocate N-vectors. */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* Set IC */
  Ith(yy, 1) = y01;
  Ith(yy, 2) = y02;
  Ith(yy, 3) = y03;
  Ith(yy, 4) = y04;
  Ith(yy, 5) = y05;
  Ith(yy, 6) = data->Ks * y01 * y04;

  /* Get y' = - res(t0, y, 0) */
  N_VConst(ZERO, yp);

  rr = N_VClone(yy);
  res(T0, yy, yp, rr, data);
  N_VScale(-ONE, rr, yp);
  N_VDestroy(rr);

  /* Create and initialize q0 for quadratures. */
  q = N_VNew_Serial(1, ctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Call IDACreate and IDAInit to initialize IDA memory */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDAInit(mem, res, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set tolerances. */
  retval = IDASStolerances(mem, RTOL, ATOL);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Attach user data. */
  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Initialize QUADRATURE(S). */
  retval = IDAQuadInit(mem, rhsQ, q);
  if (check_retval(&retval, "IDAQuadInit", 1)) { return (1); }

  /* Set tolerances and error control for quadratures. */
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  if (check_retval(&retval, "IDAQuadSStolerances", 1)) { return (1); }

  retval = IDASetQuadErrCon(mem, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrCon", 1)) { return (1); }

  /* Prepare ADJOINT. */
  retval = IDAAdjInit(mem, STEPS, IDA_HERMITE);
  if (check_retval(&retval, "IDAAdjInit", 1)) { return (1); }

  /* FORWARD run. */
  printf("Forward integration ... ");
  retval = IDASolveF(mem, TF, &time, yy, yp, IDA_NORMAL, &ncheck);
  if (check_retval(&retval, "IDASolveF", 1)) { return (1); }

  retval = IDAGetNumSteps(mem, &nst);
  if (check_retval(&retval, "IDAGetNumSteps", 1)) { return (1); }

  printf("done ( nst = %ld )\n", nst);

  retval = IDAGetQuad(mem, &time, q);
  if (check_retval(&retval, "IDAGetQuad", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %24.16Lf \n", Ith(q, 1));
#else
  printf("G:          %24.16f \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n\n");

  /* BACKWARD run */

  /* Initialize yB */
  yB = N_VClone(yy);
  if (check_retval((void*)yB, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yB);

  ypB = N_VClone(yB);
  if (check_retval((void*)ypB, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, ypB);
  Ith(ypB, 1) = -ONE;

  retval = IDACreateB(mem, &indexB);
  if (check_retval(&retval, "IDACreateB", 1)) { return (1); }

  retval = IDAInitB(mem, indexB, resB, TF, yB, ypB);
  if (check_retval(&retval, "IDAInitB", 1)) { return (1); }

  retval = IDASStolerancesB(mem, indexB, RTOLB, ATOLB);
  if (check_retval(&retval, "IDASStolerancesB", 1)) { return (1); }

  retval = IDASetUserDataB(mem, indexB, data);
  if (check_retval(&retval, "IDASetUserDataB", 1)) { return (1); }

  retval = IDASetMaxNumStepsB(mem, indexB, 1000);

  /* Create dense SUNMatrix for use in linear solves */
  AB = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)AB, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB = SUNLinSol_Dense(yB, AB, ctx);
  if (check_retval((void*)LSB, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(mem, indexB, LSB, AB);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  printf("Backward integration ... ");

  retval = IDASolveB(mem, T0, IDA_NORMAL);
  if (check_retval(&retval, "IDASolveB", 1)) { return (1); }

  IDAGetNumSteps(IDAGetAdjIDABmem(mem, indexB), &nstB);
  printf("done ( nst = %ld )\n", nstB);

  retval = IDAGetB(mem, indexB, &time, yB, ypB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  PrintOutput(time, yB, ypB);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB);
  SUNMatDestroy(AB);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(yB);
  N_VDestroy(ypB);
  N_VDestroy(q);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}